

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int fits_read_wcstab(fitsfile *fptr,int nwtb,wtbarr *wtb,int *status)

{
  int iVar1;
  void *pvVar2;
  wtbarr *local_68;
  wtbarr *wtbp;
  long nelem;
  long *naxes;
  int local_48;
  int nostat;
  int naxis;
  int m;
  int iwtb;
  int hdunum;
  int colnum;
  int anynul;
  int *status_local;
  wtbarr *wtb_local;
  fitsfile *pfStack_18;
  int nwtb_local;
  fitsfile *fptr_local;
  
  if (*status == 0) {
    if (fptr == (fitsfile *)0x0) {
      *status = 0x73;
      fptr_local._4_4_ = 0x73;
    }
    else if (nwtb == 0) {
      fptr_local._4_4_ = 0;
    }
    else {
      local_68 = wtb;
      for (naxis = 0; naxis < nwtb; naxis = naxis + 1) {
        *local_68->arrayp = (double *)0x0;
        local_68 = local_68 + 1;
      }
      _colnum = status;
      status_local = &wtb->i;
      wtb_local._4_4_ = nwtb;
      pfStack_18 = fptr;
      ffghdn(fptr,&m);
      local_68 = (wtbarr *)status_local;
      naxis = 0;
      while( true ) {
        nelem = 0;
        if (((wtb_local._4_4_ <= naxis) ||
            (iVar1 = ffmnhd(pfStack_18,2,(char *)((long)local_68 + 0xc),
                            *(int *)((long)local_68 + 0x54),_colnum), iVar1 != 0)) ||
           (iVar1 = ffgcno(pfStack_18,0,(char *)((long)local_68 + 0x5c),&iwtb,_colnum), iVar1 != 0))
        goto LAB_0027ff4b;
        if (*(int *)((long)local_68 + 0xb0) < 1) break;
        nelem = (long)calloc((long)*(int *)((long)local_68 + 0xb0),8);
        if ((long *)nelem == (long *)0x0) {
          *_colnum = 0x71;
          goto LAB_0027ff4b;
        }
        iVar1 = ffgtdm(pfStack_18,iwtb,*(int *)((long)local_68 + 0xb0),&local_48,(long *)nelem,
                       _colnum);
        if (iVar1 != 0) goto LAB_0027ff4b;
        if (local_48 != *(int *)((long)local_68 + 0xb0)) {
          if ((*(int *)((long)local_68 + 8) != 99) || (*(int *)((long)local_68 + 0xb0) != 2)) {
            *_colnum = 0x107;
            goto LAB_0027ff4b;
          }
          local_48 = 2;
          *(long *)(nelem + 8) = *(long *)nelem;
          *(long *)nelem = 1;
        }
        if (*(int *)((long)local_68 + 8) == 99) {
          wtbp = *(wtbarr **)nelem;
          for (nostat = 0; nostat < local_48 + -1; nostat = nostat + 1) {
            *(int *)(*(long *)((long)local_68 + 0xb8) + (long)nostat * 4) =
                 (int)*(long *)(nelem + (long)(nostat + 1) * 8);
            wtbp = (wtbarr *)(*(long *)(nelem + (long)(nostat + 1) * 8) * (long)wtbp);
          }
        }
        else {
          wtbp = *(wtbarr **)nelem;
          if (wtbp != (wtbarr *)(long)**(int **)((long)local_68 + 0xb8)) {
            *_colnum = 0x107;
            goto LAB_0027ff4b;
          }
        }
        free((void *)nelem);
        nelem = 0;
        pvVar2 = calloc((size_t)wtbp,8);
        **(undefined8 **)((long)local_68 + 0xc0) = pvVar2;
        if (pvVar2 == (void *)0x0) {
          *_colnum = 0x71;
          goto LAB_0027ff4b;
        }
        iVar1 = ffgcvd(pfStack_18,iwtb,*(LONGLONG *)((long)local_68 + 0xa8),1,(LONGLONG)wtbp,0.0,
                       (double *)**(undefined8 **)((long)local_68 + 0xc0),&hdunum,_colnum);
        if (iVar1 != 0) goto LAB_0027ff4b;
        naxis = naxis + 1;
        local_68 = (wtbarr *)((long)local_68 + 200);
      }
      *_colnum = 0x143;
LAB_0027ff4b:
      naxes._4_4_ = 0;
      ffmahd(pfStack_18,m,(int *)0x0,(int *)((long)&naxes + 4));
      if (nelem != 0) {
        free((void *)nelem);
      }
      if (*_colnum != 0) {
        local_68 = (wtbarr *)status_local;
        for (naxis = 0; naxis < wtb_local._4_4_; naxis = naxis + 1) {
          if (**(long **)((long)local_68 + 0xc0) != 0) {
            free((void *)**(undefined8 **)((long)local_68 + 0xc0));
          }
          local_68 = (wtbarr *)((long)local_68 + 200);
        }
      }
      fptr_local._4_4_ = *_colnum;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_read_wcstab(
   fitsfile   *fptr, /* I - FITS file pointer           */
   int  nwtb,        /* Number of arrays to be read from the binary table(s) */
   wtbarr *wtb,      /* Address of the first element of an array of wtbarr
                         typedefs.  This wtbarr typedef is defined below to
                         match the wtbarr struct defined in WCSLIB.  An array
                         of such structs returned by the WCSLIB function
                         wcstab(). */
   int  *status)

/*
*   Author: Mark Calabretta, Australia Telescope National Facility
*   http://www.atnf.csiro.au/~mcalabre/index.html
*
*   fits_read_wcstab() extracts arrays from a binary table required in
*   constructing -TAB coordinates.  This helper routine is intended for
*   use by routines in the WCSLIB library when dealing with the -TAB table
*   look up WCS convention.
*/

{
   int  anynul, colnum, hdunum, iwtb, m, naxis, nostat;
   long *naxes = 0, nelem;
   wtbarr *wtbp;


   if (*status) return *status;

   if (fptr == 0) {
      return (*status = NULL_INPUT_PTR);
   }

   if (nwtb == 0) return 0;

   /* Zero the array pointers. */
   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
     *wtbp->arrayp = 0x0;
   }

   /* Save HDU number so that we can move back to it later. */
   fits_get_hdu_num(fptr, &hdunum);

   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
      /* Move to the required binary table extension. */
      if (fits_movnam_hdu(fptr, BINARY_TBL, (char *)(wtbp->extnam),
          wtbp->extver, status)) {
         goto cleanup;
      }

      /* Locate the table column. */
      if (fits_get_colnum(fptr, CASEINSEN, (char *)(wtbp->ttype), &colnum,
          status)) {
         goto cleanup;
      }

      /* Get the array dimensions and check for consistency. */
      if (wtbp->ndim < 1) {
         *status = NEG_AXIS;
         goto cleanup;
      }

      if (!(naxes = calloc(wtbp->ndim, sizeof(long)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      if (fits_read_tdim(fptr, colnum, wtbp->ndim, &naxis, naxes, status)) {
         goto cleanup;
      }

      if (naxis != wtbp->ndim) {
         if (wtbp->kind == 'c' && wtbp->ndim == 2) {
            /* Allow TDIMn to be omitted for degenerate coordinate arrays. */
            naxis = 2;
            naxes[1] = naxes[0];
            naxes[0] = 1;
         } else {
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      if (wtbp->kind == 'c') {
         /* Coordinate array; calculate the array size. */
         nelem = naxes[0];
         for (m = 0; m < naxis-1; m++) {
            *(wtbp->dimlen + m) = naxes[m+1];
            nelem *= naxes[m+1];
         }
      } else {
         /* Index vector; check length. */
         if ((nelem = naxes[0]) != *(wtbp->dimlen)) {
            /* N.B. coordinate array precedes the index vectors. */
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      free(naxes);
      naxes = 0;

      /* Allocate memory for the array. */
      if (!(*wtbp->arrayp = calloc((size_t)nelem, sizeof(double)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      /* Read the array from the table. */
      if (fits_read_col_dbl(fptr, colnum, wtbp->row, 1L, nelem, 0.0,
          *wtbp->arrayp, &anynul, status)) {
         goto cleanup;
      }
   }

cleanup:
   /* Move back to the starting HDU. */
   nostat = 0;
   fits_movabs_hdu(fptr, hdunum, 0, &nostat);

   /* Release allocated memory. */
   if (naxes) free(naxes);
   if (*status) {
      wtbp = wtb;
      for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
         if (*wtbp->arrayp) free(*wtbp->arrayp);
      }
   }

   return *status;
}